

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

bool anon_unknown.dwarf_9d8bc::isIdStart(QChar c)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = QChar::category((uint)(ushort)c.ucs);
  if ((0xe < iVar1 - 4U) || (bVar2 = true, (0x7c01U >> (iVar1 - 4U & 0x1f) & 1) == 0)) {
    bVar2 = c.ucs == L'_';
  }
  return bVar2;
}

Assistant:

static bool isIdStart(QChar c)
    {
        bool result = false;
        switch (c.category()) {
        case QChar::Letter_Uppercase:
        case QChar::Letter_Lowercase:
        case QChar::Letter_Titlecase:
        case QChar::Letter_Modifier:
        case QChar::Letter_Other:
        case QChar::Number_Letter:
            result = true;
            break;
        default:
            result = c == u'_';
            break;
        }
        return result;
    }